

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::Blur(Element *this)

{
  Element *this_00;
  ElementDocument *this_01;
  Context *this_02;
  Element *pEVar1;
  
  if (this->parent != (Element *)0x0) {
    this_01 = GetOwnerDocument(this);
    if (this_01 != (ElementDocument *)0x0) {
      this_02 = ElementDocument::GetContext(this_01);
      if (this_02 != (Context *)0x0) {
        pEVar1 = Context::GetFocusElement(this_02);
        this_00 = this->parent;
        if (pEVar1 == this) {
          Focus(this_00,false);
          return;
        }
        if (this_00->focus == this) {
          this_00->focus = (Element *)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void Element::Blur()
{
	if (parent)
	{
		Context* context = GetContext();
		if (context == nullptr)
			return;

		if (context->GetFocusElement() == this)
		{
			parent->Focus();
		}
		else if (parent->focus == this)
		{
			parent->focus = nullptr;
		}
	}
}